

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O0

idx_t duckdb::DistinctSelectFlatLoopSelSwitch<float,float,duckdb::DistinctFrom,true,false,true>
                (float *ldata,float *rdata,SelectionVector *sel,idx_t count,ValidityMask *lmask,
                ValidityMask *rmask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  ValidityMask *in_RSI;
  ValidityMask *in_RDI;
  SelectionVector *unaff_retaddr;
  float *in_stack_00000008;
  idx_t in_stack_fffffffffffffff8;
  
  if ((in_stack_00000008 == (float *)0x0) || (rmask == (ValidityMask *)0x0)) {
    if (in_stack_00000008 == (float *)0x0) {
      iVar1 = DistinctSelectFlatLoop<float,float,duckdb::DistinctFrom,true,false,true,false,true>
                        ((float *)rmask,(float *)0x0,unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,
                         in_RSI,(SelectionVector *)count,sel);
    }
    else {
      iVar1 = DistinctSelectFlatLoop<float,float,duckdb::DistinctFrom,true,false,true,true,false>
                        ((float *)rmask,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                         in_RDI,in_RSI,(SelectionVector *)count,sel);
    }
  }
  else {
    iVar1 = DistinctSelectFlatLoop<float,float,duckdb::DistinctFrom,true,false,true,true,true>
                      ((float *)rmask,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                       in_RDI,in_RSI,(SelectionVector *)count,sel);
  }
  return iVar1;
}

Assistant:

static inline idx_t DistinctSelectFlatLoopSelSwitch(LEFT_TYPE *__restrict ldata, RIGHT_TYPE *__restrict rdata,
                                                    const SelectionVector *sel, idx_t count, ValidityMask &lmask,
                                                    ValidityMask &rmask, SelectionVector *true_sel,
                                                    SelectionVector *false_sel) {
	if (true_sel && false_sel) {
		return DistinctSelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, NO_NULL, true, true>(
		    ldata, rdata, sel, count, lmask, rmask, true_sel, false_sel);
	} else if (true_sel) {
		return DistinctSelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, NO_NULL, true, false>(
		    ldata, rdata, sel, count, lmask, rmask, true_sel, false_sel);
	} else {
		D_ASSERT(false_sel);
		return DistinctSelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, NO_NULL, false, true>(
		    ldata, rdata, sel, count, lmask, rmask, true_sel, false_sel);
	}
}